

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O1

Bool_conflict CPU_Is_InOrder(void)

{
  long lVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  UInt32 *pUVar8;
  ulong uVar9;
  int iVar10;
  ulong in_R10;
  bool bVar11;
  
  uVar9 = 0;
  lVar1 = cpuid_basic_info(0);
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar3 = *puVar2;
  uVar5 = uVar3 >> 8 & 0xf | uVar3 >> 0x10 & 0xff0;
  uVar6 = uVar3 >> 0xc & 0xf0;
  uVar4 = uVar3 >> 4 & 0xf | uVar6;
  pUVar8 = kVendors[0] + 2;
  do {
    bVar11 = true;
    if ((((*(UInt32 (*) [3])(pUVar8 + -2))[0] == *(UInt32 *)(lVar1 + 4)) &&
        (pUVar8[-1] == *(UInt32 *)(lVar1 + 8))) && (*pUVar8 == *(UInt32 *)(lVar1 + 0xc))) {
      bVar11 = false;
      in_R10 = uVar9 & 0xffffffff;
    }
    iVar10 = (int)in_R10;
    if (!bVar11) goto LAB_0070cdb7;
    uVar9 = uVar9 + 1;
    pUVar8 = pUVar8 + 3;
  } while (uVar9 != 3);
  iVar10 = -1;
LAB_0070cdb7:
  if (iVar10 == 2) {
    bVar11 = uVar4 < 0xf && uVar5 == 6;
LAB_0070ce19:
    uVar7 = (uint)(byte)(bVar11 | uVar5 < 6);
  }
  else {
    uVar7 = 1;
    if (iVar10 == 1) {
      if (uVar5 < 5) goto LAB_0070ce1f;
      if (uVar5 == 5) {
        bVar11 = uVar4 == 10;
        uVar5 = uVar4;
        goto LAB_0070ce19;
      }
    }
    else {
      if ((iVar10 != 0) || (uVar5 < 6)) goto LAB_0070ce1f;
      if (uVar5 == 6) {
        if ((uVar3 >> 4 & 0xe | uVar6) == 0x26) goto LAB_0070ce1f;
        if (uVar4 < 0x37) {
          uVar7 = (uint)(0x60000010000000 >> ((byte)uVar4 & 0x3f));
          goto LAB_0070ce1f;
        }
      }
    }
    uVar7 = 0;
  }
LAB_0070ce1f:
  return uVar7 & 1;
}

Assistant:

Bool CPU_Is_InOrder()
{
  Cx86cpuid p;
  int firm;
  UInt32 family, model;
  if (!x86cpuid_CheckAndRead(&p))
    return True;

  family = x86cpuid_GetFamily(p.ver);
  model = x86cpuid_GetModel(p.ver);
  
  firm = x86cpuid_GetFirm(&p);

  switch (firm)
  {
    case CPU_FIRM_INTEL: return (family < 6 || (family == 6 && (
        /* In-Order Atom CPU */
           model == 0x1C  /* 45 nm, N4xx, D4xx, N5xx, D5xx, 230, 330 */
        || model == 0x26  /* 45 nm, Z6xx */
        || model == 0x27  /* 32 nm, Z2460 */
        || model == 0x35  /* 32 nm, Z2760 */
        || model == 0x36  /* 32 nm, N2xxx, D2xxx */
        )));
    case CPU_FIRM_AMD: return (family < 5 || (family == 5 && (model < 6 || model == 0xA)));
    case CPU_FIRM_VIA: return (family < 6 || (family == 6 && model < 0xF));
  }
  return True;
}